

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.cpp
# Opt level: O0

void * CorUnix::InternalRealloc(void *pvMemblock,size_t szSize)

{
  undefined8 local_20;
  void *pvMem;
  size_t szSize_local;
  void *pvMemblock_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (szSize == 0) {
    if (pvMemblock != (void *)0x0) {
      InternalFree(pvMemblock);
    }
    local_20 = (void *)0x0;
  }
  else {
    local_20 = realloc(pvMemblock,szSize);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return local_20;
}

Assistant:

void *
CorUnix::InternalRealloc(
    void* pvMemblock,
    size_t szSize
    )
{
    void *pvMem;

    PERF_ENTRY(InternalRealloc);
    ENTRY("realloc (memblock:%p size=%d)\n", pvMemblock, szSize);    
       
    if (szSize == 0)
    {
        // If pvMemblock is NULL, there's no reason to call free.
        if (pvMemblock != NULL)
        {
            InternalFree(pvMemblock);
        }
        pvMem = NULL;
    }
    else
    {
        pvMem = realloc(pvMemblock, szSize);
    }

    LOGEXIT("realloc returns void * %p\n", pvMem);
    PERF_EXIT(InternalRealloc);
    return pvMem;
}